

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_grow.cpp
# Opt level: O3

int __thiscall
rg::RGProblem::getInnerObstacles
          (RGProblem *this,Vector3i *upper_vertex,Vector3i *lower_vertex,
          vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
          *obstacles)

{
  pointer *ppMVar1;
  int iVar2;
  pointer pMVar3;
  iterator __position;
  Matrix<int,_3,_1,_0,_3,_1> *__args;
  
  pMVar3 = (obstacles->
           super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((obstacles->
      super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pMVar3) {
    (obstacles->
    super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pMVar3;
  }
  __args = *(Matrix<int,_3,_1,_0,_3,_1> **)this;
  do {
    iVar2 = (__args->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[0];
    if ((((iVar2 <= (upper_vertex->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).
                    m_storage.m_data.array[0] + 1) &&
         ((lower_vertex->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data
          .array[0] + -1 <= iVar2)) &&
        (iVar2 = (__args->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[1],
        iVar2 <= (upper_vertex->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage
                 .m_data.array[1] + 1)) &&
       ((((lower_vertex->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data
          .array[1] + -1 <= iVar2 &&
         (iVar2 = (__args->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[2],
         iVar2 <= (upper_vertex->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).
                  m_storage.m_data.array[2] + 1)) &&
        ((lower_vertex->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.
         array[2] + -1 <= iVar2)))) {
      __position._M_current =
           (obstacles->
           super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (obstacles->
          super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Eigen::Matrix<int,3,1,0,3,1>,std::allocator<Eigen::Matrix<int,3,1,0,3,1>>>::
        _M_realloc_insert<Eigen::Matrix<int,3,1,0,3,1>const&>
                  ((vector<Eigen::Matrix<int,3,1,0,3,1>,std::allocator<Eigen::Matrix<int,3,1,0,3,1>>>
                    *)obstacles,__position,__args);
      }
      else {
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[2] =
             (__args->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[2];
        *(undefined8 *)
         ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).
         m_storage.m_data.array =
             *(undefined8 *)
              (__args->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array;
        ppMVar1 = &(obstacles->
                   super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
    }
    __args = __args + 1;
  } while( true );
}

Assistant:

int RGProblem::getInnerObstacles(const Eigen::Vector3i &upper_vertex, const Eigen::Vector3i &lower_vertex, std::vector<Eigen::Vector3i> *obstacles) const
{
  obstacles->clear();

  for (auto it = this->obstacle_pts.cbegin(); it != this->obstacle_pts.cend(); ++it)
  {
    if ( (it->x() <= upper_vertex.x() + 1) && (it->x() >= lower_vertex.x() - 1)
    && (it->y() <= upper_vertex.y() + 1) && (it->y() >= lower_vertex.y() - 1)
    && (it->z() <= upper_vertex.z() + 1) && (it->z() >= lower_vertex.z() - 1) )
      obstacles->push_back(*it);
  }
}